

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O1

Scale * icu_63::number::Scale::byDoubleAndPowerOfTen
                  (Scale *__return_storage_ptr__,double multiplicand,int32_t power)

{
  DecNum *pDVar1;
  undefined4 in_register_00000034;
  UErrorCode *status;
  UErrorCode *p;
  UErrorCode localError;
  LocalPointer<icu_63::number::impl::DecNum> decnum;
  UErrorCode local_2c;
  DecNum *local_28;
  double local_20;
  
  status = (UErrorCode *)CONCAT44(in_register_00000034,power);
  p = (UErrorCode *)(ulong)(uint)power;
  local_2c = U_ZERO_ERROR;
  local_20 = multiplicand;
  local_28 = (DecNum *)UMemory::operator_new((UMemory *)0x60,(size_t)status);
  if (local_28 == (DecNum *)0x0) {
    local_28 = (DecNum *)0x0;
  }
  else {
    impl::DecNum::DecNum(local_28);
  }
  if ((local_28 == (DecNum *)0x0) && (local_2c < U_ILLEGAL_ARGUMENT_ERROR)) {
    local_2c = U_MEMORY_ALLOCATION_ERROR;
  }
  if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
    status = &local_2c;
    impl::DecNum::setTo(local_28,local_20,status);
    pDVar1 = local_28;
    if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
      local_28 = (DecNum *)0x0;
      Scale(__return_storage_ptr__,power,pDVar1);
      goto LAB_0026442b;
    }
  }
  p = status;
  __return_storage_ptr__->fMagnitude = 0;
  __return_storage_ptr__->fArbitrary = (DecNum *)0x0;
  __return_storage_ptr__->fError = local_2c;
LAB_0026442b:
  pDVar1 = local_28;
  if (local_28 != (DecNum *)0x0) {
    MaybeStackHeaderAndArray<decNumber,_char,_34>::~MaybeStackHeaderAndArray(&local_28->fData);
    UMemory::operator_delete((UMemory *)pDVar1,p);
  }
  return __return_storage_ptr__;
}

Assistant:

Scale Scale::byDoubleAndPowerOfTen(double multiplicand, int32_t power) {
    UErrorCode localError = U_ZERO_ERROR;
    LocalPointer<DecNum> decnum(new DecNum(), localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    decnum->setTo(multiplicand, localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    return {power, decnum.orphan()};
}